

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_frame_write(lws *wsi,int type,int flags,uint sid,uint len,uchar *buf)

{
  lws *wsi_00;
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  int n;
  uchar *p;
  lws *nwsi;
  uchar *buf_local;
  uint len_local;
  uint sid_local;
  int flags_local;
  int type_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  buf[-9] = (uchar)(len >> 0x10);
  buf[-8] = (uchar)(len >> 8);
  buf[-7] = (uchar)len;
  buf[-6] = (uchar)type;
  buf[-5] = (uchar)flags;
  buf[-4] = (uchar)(sid >> 0x18);
  buf[-3] = (uchar)(sid >> 0x10);
  buf[-2] = (uchar)(sid >> 8);
  buf[-1] = (uchar)sid;
  pcVar1 = lws_wsi_tag(wsi);
  pcVar2 = lws_wsi_tag(wsi_00);
  iVar4 = (wsi->txc).tx_cr;
  iVar5 = (wsi_00->txc).tx_cr;
  uVar3 = len;
  _lws_log(0x10,"%s: %s (eff %s). typ %d, fl 0x%x, sid=%d, len=%d, txcr=%d, nwsi->txcr=%d\n",
           "lws_h2_frame_write",pcVar1,pcVar2,(ulong)(uint)type,flags,sid,len,iVar4,iVar5);
  if (type == 0) {
    if ((wsi->txc).tx_cr < (int)len) {
      pcVar1 = lws_wsi_tag(wsi);
      _lws_log(8,"%s: %s: sending payload len %d but tx_cr only %d!\n","lws_h2_frame_write",pcVar1,
               (ulong)len,(ulong)(uint)(wsi->txc).tx_cr,flags,sid,uVar3,iVar4,iVar5);
    }
    lws_h2_tx_cr_consume(wsi,len);
  }
  wsi_local._4_4_ = lws_issue_raw(wsi_00,buf + -9,(ulong)(len + 9));
  if ((-1 < wsi_local._4_4_) && (8 < wsi_local._4_4_)) {
    wsi_local._4_4_ = wsi_local._4_4_ + -9;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_h2_frame_write(struct lws *wsi, int type, int flags,
		       unsigned int sid, unsigned int len, unsigned char *buf)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	unsigned char *p = &buf[-LWS_H2_FRAME_HEADER_LENGTH];
	int n;

	//if (wsi->h2_stream_carries_ws)
	// lwsl_hexdump_level(LLL_NOTICE, buf, len);

	*p++ = (uint8_t)(len >> 16);
	*p++ = (uint8_t)(len >> 8);
	*p++ = (uint8_t)len;
	*p++ = (uint8_t)type;
	*p++ = (uint8_t)flags;
	*p++ = (uint8_t)(sid >> 24);
	*p++ = (uint8_t)(sid >> 16);
	*p++ = (uint8_t)(sid >> 8);
	*p++ = (uint8_t)sid;

	lwsl_debug("%s: %s (eff %s). typ %d, fl 0x%x, sid=%d, len=%d, "
		   "txcr=%d, nwsi->txcr=%d\n", __func__, lws_wsi_tag(wsi),
		   lws_wsi_tag(nwsi), type, flags,
		   sid, len, (int)wsi->txc.tx_cr, (int)nwsi->txc.tx_cr);

	if (type == LWS_H2_FRAME_TYPE_DATA) {
		if (wsi->txc.tx_cr < (int)len)

			lwsl_info("%s: %s: sending payload len %d"
				 " but tx_cr only %d!\n", __func__,
				 lws_wsi_tag(wsi), len, (int)wsi->txc.tx_cr);
				lws_h2_tx_cr_consume(wsi, (int)len);
	}

	n = lws_issue_raw(nwsi, &buf[-LWS_H2_FRAME_HEADER_LENGTH],
			  len + LWS_H2_FRAME_HEADER_LENGTH);
	if (n < 0)
		return n;

	if (n >= LWS_H2_FRAME_HEADER_LENGTH)
		return n - LWS_H2_FRAME_HEADER_LENGTH;

	return n;
}